

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O2

ptr<snapshot> __thiscall nuraft::snapshot::deserialize(snapshot *this,buffer_serializer *bs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<snapshot> pVar1;
  type snp_type;
  ptr<cluster_config> conf;
  ulong size;
  ulong last_log_term;
  ulong last_log_idx;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  uint64_t local_48;
  shared_ptr<nuraft::cluster_config> local_40;
  
  buffer_serializer::get_u8(bs);
  local_40.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)buffer_serializer::get_u64(bs);
  local_40.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)buffer_serializer::get_u64(bs);
  local_48 = buffer_serializer::get_u64(bs);
  cluster_config::deserialize((cluster_config *)&stack0xffffffffffffffa8,bs);
  std::
  make_shared<nuraft::snapshot,unsigned_long&,unsigned_long&,std::shared_ptr<nuraft::cluster_config>&,unsigned_long&,nuraft::snapshot::type&>
            (&this->last_log_idx_,
             (unsigned_long *)
             &local_40.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_40,(unsigned_long *)&stack0xffffffffffffffa8,(type *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<snapshot>)pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> snapshot::deserialize(buffer_serializer& bs) {
    type snp_type = static_cast<type>(bs.get_u8());
    ulong last_log_idx = bs.get_u64();
    ulong last_log_term = bs.get_u64();
    ulong size = bs.get_u64();
    ptr<cluster_config> conf( cluster_config::deserialize(bs) );
    return cs_new<snapshot>(last_log_idx, last_log_term, conf, size, snp_type);
}